

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void chebyshev_set(int n,double *x,double *w)

{
  ostream *poVar1;
  double dVar2;
  int local_24;
  int i;
  double *w_local;
  double *x_local;
  int n_local;
  
  if (n == 1) {
    *x = 0.0;
  }
  else if (n == 2) {
    dVar2 = sqrt(3.0);
    *x = -1.0 / dVar2;
    dVar2 = sqrt(3.0);
    x[1] = 1.0 / dVar2;
  }
  else if (n == 3) {
    dVar2 = sqrt(2.0);
    *x = -1.0 / dVar2;
    x[1] = 0.0;
    dVar2 = sqrt(2.0);
    x[2] = 1.0 / dVar2;
  }
  else if (n == 4) {
    dVar2 = sqrt(5.0);
    dVar2 = sqrt((2.0 / dVar2 + 1.0) / 3.0);
    *x = -dVar2;
    dVar2 = sqrt(5.0);
    dVar2 = sqrt((1.0 - 2.0 / dVar2) / 3.0);
    x[1] = -dVar2;
    dVar2 = sqrt(5.0);
    dVar2 = sqrt((1.0 - 2.0 / dVar2) / 3.0);
    x[2] = dVar2;
    dVar2 = sqrt(5.0);
    dVar2 = sqrt((2.0 / dVar2 + 1.0) / 3.0);
    x[3] = dVar2;
  }
  else if (n == 5) {
    dVar2 = sqrt(11.0);
    dVar2 = sqrt((dVar2 + 5.0) / 12.0);
    *x = -dVar2;
    dVar2 = sqrt(11.0);
    dVar2 = sqrt((5.0 - dVar2) / 12.0);
    x[1] = -dVar2;
    x[2] = 0.0;
    dVar2 = sqrt(11.0);
    dVar2 = sqrt((5.0 - dVar2) / 12.0);
    x[3] = dVar2;
    dVar2 = sqrt(11.0);
    dVar2 = sqrt((dVar2 + 5.0) / 12.0);
    x[4] = dVar2;
  }
  else if (n == 6) {
    *x = -0.8662468181078206;
    x[1] = -0.42251865376111153;
    x[2] = -0.26663540151670473;
    x[3] = 0.26663540151670473;
    x[4] = 0.42251865376111153;
    x[5] = 0.8662468181078206;
  }
  else if (n == 7) {
    *x = -0.883861700758049;
    x[1] = -0.5296567752851569;
    x[2] = -0.32391181051990764;
    x[3] = 0.0;
    x[4] = 0.32391181051990764;
    x[5] = 0.5296567752851569;
    x[6] = 0.883861700758049;
  }
  else {
    if (n != 9) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"CHEBYSHEV_SET - Fatal error!\n");
      poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
      std::operator<<(poVar1,"\n");
      std::operator<<((ostream *)&std::cerr,"  Legal values are 1 through 7, and 9.\n");
      exit(1);
    }
    *x = -0.9115893077284345;
    x[1] = -0.601018655380238;
    x[2] = -0.52876178305788;
    x[3] = -0.16790618421480394;
    x[4] = 0.0;
    x[5] = 0.16790618421480394;
    x[6] = 0.52876178305788;
    x[7] = 0.601018655380238;
    x[8] = 0.9115893077284345;
  }
  for (local_24 = 0; local_24 < n; local_24 = local_24 + 1) {
    w[local_24] = 2.0 / (double)n;
  }
  return;
}

Assistant:

void chebyshev_set ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBYSHEV_SET sets abscissas and weights for Chebyshev quadrature.
//
//  Discussion:
//
//    The integral to be estimated:
//
//      I(f) = integral ( -1 <= X <= 1 ) F(X) dX
//
//    The quadrature rule:
//
//      Q(f,n) = sum ( 1 <= I <= N ) W[I] * F ( X[I] )
//
//    The Chebyshev rule is distinguished by using equal weights.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    30 April 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Hermann Engels,
//    Numerical Quadrature and Cubature,
//    Academic Press, 1980.
//
//    Zdenek Kopal,
//    Numerical Analysis,
//    John Wiley, 1955.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996,
//    ISBN: 0-8493-2479-3.
//
//  Parameters:
//
//    Input, int N, the order.
//    N may only have the values 1, 2, 3, 4, 5, 6, 7 or 9.
//    There are NO other Chebyshev rules with real abscissas.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;

  if ( n == 1 )
  {
    x[0] = 0.0;
  }
  else if ( n == 2 )
  {
    x[0] = - 1.0 / sqrt ( 3.0 );
    x[1] =   1.0 / sqrt ( 3.0 );
  }
  else if ( n == 3 )
  {
    x[0] = - 1.0 / sqrt ( 2.0 );
    x[1] =   0.0;
    x[2] =   1.0 / sqrt ( 2.0 );
  }
  else if ( n == 4 )
  {
    x[0] =   - sqrt ( ( 1.0 + 2.0 / sqrt ( 5.0 ) ) / 3.0 );
    x[1] =   - sqrt ( ( 1.0 - 2.0 / sqrt ( 5.0 ) ) / 3.0 );
    x[2] =     sqrt ( ( 1.0 - 2.0 / sqrt ( 5.0 ) ) / 3.0 );
    x[3] =     sqrt ( ( 1.0 + 2.0 / sqrt ( 5.0 ) ) / 3.0 );
  }
  else if ( n == 5 )
  {
    x[0] = - sqrt ( ( 5.0 + sqrt ( 11.0 ) ) / 12.0 );
    x[1] = - sqrt ( ( 5.0 - sqrt ( 11.0 ) ) / 12.0 );
    x[2] =   0.0;
    x[3] =   sqrt ( ( 5.0 - sqrt ( 11.0 ) ) / 12.0 );
    x[4] =   sqrt ( ( 5.0 + sqrt ( 11.0 ) ) / 12.0 );
  }
  else if ( n == 6 )
  {
    x[0] = - 0.866246818107820591383598;
    x[1] = - 0.422518653761111529118546;
    x[2] = - 0.266635401516704720331534;
    x[3] =   0.266635401516704720331534;
    x[4] =   0.422518653761111529118546;
    x[5] =   0.866246818107820591383598;
  }
  else if ( n == 7 )
  {
    x[0] = - 0.883861700758049035704224;
    x[1] = - 0.529656775285156811385048;
    x[2] = - 0.323911810519907637519673;
    x[3] =   0.0;
    x[4] =   0.323911810519907637519673;
    x[5] =   0.529656775285156811385048;
    x[6] =   0.883861700758049035704224;
  }
  else if ( n == 9 )
  {
    x[0] = - 0.911589307728434473664949;
    x[1] = - 0.601018655380238071428128;
    x[2] = - 0.528761783057879993260181;
    x[3] = - 0.167906184214803943068031;
    x[4] =   0.0;
    x[5] =   0.167906184214803943068031;
    x[6] =   0.528761783057879993260181;
    x[7] =   0.601018655380238071428128;
    x[8] =   0.911589307728434473664949;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "CHEBYSHEV_SET - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    std::cerr << "  Legal values are 1 through 7, and 9.\n";
    exit ( 1 );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 2.0 / double( n );
  }

  return;
}